

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

QWidget * __thiscall
QAbstractItemViewPrivate::editor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QStyleOptionViewItem *options)

{
  Data *pDVar1;
  QEditorInfo *pQVar2;
  long *plVar3;
  QWidget *editor;
  undefined4 *puVar4;
  QAbstractItemViewPrivate *this_00;
  QAbstractItemViewPrivate *first;
  long in_FS_OFFSET;
  QSlotObjectBase local_60;
  Connection local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  first = *(QAbstractItemViewPrivate **)
           &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
            field_0x8;
  pQVar2 = editorForIndex(this,index);
  pDVar1 = (pQVar2->widget).wp.d;
  if (pDVar1 != (Data *)0x0) {
    editor = (QWidget *)(pQVar2->widget).wp.value;
    if (editor != (QWidget *)0x0 && *(int *)(pDVar1 + 4) != 0) goto LAB_00539298;
  }
  plVar3 = (long *)(**(code **)(*(long *)&(first->super_QAbstractScrollAreaPrivate).
                                          super_QFramePrivate.super_QWidgetPrivate + 0x208))
                             (first,index);
  if (plVar3 != (long *)0x0) {
    editor = (QWidget *)
             (**(code **)(*plVar3 + 0x70))
                       (plVar3,(this->super_QAbstractScrollAreaPrivate).viewport,options,index);
    if (editor != (QWidget *)0x0) {
      QObject::installEventFilter((QObject *)editor);
      local_60.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x2a1;
      local_60._4_4_ = 0;
      local_60.m_impl = (ImplFn)0x0;
      local_48 = QObject::destroyed;
      local_40 = 0;
      puVar4 = (undefined4 *)operator_new(0x20);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::
           QCallableObject<void_(QAbstractItemView::*)(QObject_*),_QtPrivate::List<QObject_*>,_void>
           ::impl;
      *(undefined8 *)(puVar4 + 4) = 0x2a1;
      *(undefined8 *)(puVar4 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_50,(void **)editor,(QObject *)&local_48,(void **)first,&local_60,
                 (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_50);
      (**(code **)(*plVar3 + 0x90))(plVar3,editor,options);
      (**(code **)(*plVar3 + 0x80))(plVar3,editor,index);
      this_00 = this;
      addEditor(this,index,editor,false);
      if (*(QWidget **)(*(long *)&editor->field_0x8 + 0x10) ==
          (this->super_QAbstractScrollAreaPrivate).viewport) {
        QWidget::setTabOrder((QWidget *)first,editor);
        this_00 = first;
      }
      selectAllInEditor(this_00,editor);
      goto LAB_00539298;
    }
  }
  editor = (QWidget *)0x0;
LAB_00539298:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return editor;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QAbstractItemViewPrivate::editor(const QModelIndex &index,
                                          const QStyleOptionViewItem &options)
{
    Q_Q(QAbstractItemView);
    QWidget *w = editorForIndex(index).widget.data();
    if (!w) {
        QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        if (!delegate)
            return nullptr;
        w = delegate->createEditor(viewport, options, index);
        if (w) {
            w->installEventFilter(delegate);
            QObject::connect(w, &QWidget::destroyed, q, &QAbstractItemView::editorDestroyed);
            delegate->updateEditorGeometry(w, options, index);
            delegate->setEditorData(w, index);
            addEditor(index, w, false);
            if (w->parent() == viewport)
                QWidget::setTabOrder(q, w);

            selectAllInEditor(w);
        }
    }

    return w;
}